

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg_1.0.0.hpp
# Opt level: O2

void __thiscall svg::Font::~Font(Font *this)

{
  ~Font(this);
  operator_delete(this);
  return;
}

Assistant:

Font(double size = 12, std::string const & family = "Verdana") : size(size), family(family) { }